

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void testing::internal::FailFromInternalError(int fd)

{
  int *piVar1;
  ostream *poVar2;
  String *this;
  bool bVar3;
  String *in_stack_fffffffffffffe80;
  Message *in_stack_fffffffffffffe90;
  String local_158;
  GTestLog local_148;
  int local_144;
  undefined1 local_140 [4];
  int last_error;
  GTestLog local_130 [5];
  int local_11c;
  char local_118 [4];
  int num_read;
  char buffer [256];
  Message error;
  int fd_local;
  
  Message::Message(in_stack_fffffffffffffe90);
  do {
    while (local_11c = posix::Read(fd,local_118,0xff), 0 < local_11c) {
      local_118[local_11c] = '\0';
      Message::operator<<((Message *)(buffer + 0xf8),(char (*) [256])local_118);
    }
    bVar3 = false;
    if (local_11c == -1) {
      piVar1 = __errno_location();
      bVar3 = *piVar1 == 4;
    }
  } while (bVar3);
  if (local_11c == 0) {
    GTestLog::GTestLog(local_130,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/src/gtest-death-test.cc"
                       ,0x11d);
    poVar2 = GTestLog::GetStream(local_130);
    Message::GetString((Message *)local_140);
    operator<<(poVar2,(String *)local_140);
    String::~String(in_stack_fffffffffffffe80);
    GTestLog::~GTestLog(local_130);
  }
  else {
    piVar1 = __errno_location();
    local_144 = *piVar1;
    GTestLog::GTestLog(&local_148,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/src/gtest-death-test.cc"
                       ,0x120);
    poVar2 = GTestLog::GetStream(&local_148);
    poVar2 = std::operator<<(poVar2,"Error while reading death test internal: ");
    GetLastErrnoDescription();
    poVar2 = operator<<(poVar2,&local_158);
    this = (String *)std::operator<<(poVar2," [");
    poVar2 = (ostream *)std::ostream::operator<<(this,local_144);
    std::operator<<(poVar2,"]");
    String::~String(this);
    GTestLog::~GTestLog(&local_148);
  }
  Message::~Message((Message *)0x1538d1);
  return;
}

Assistant:

static void FailFromInternalError(int fd) {
  Message error;
  char buffer[256];
  int num_read;

  do {
    while ((num_read = posix::Read(fd, buffer, 255)) > 0) {
      buffer[num_read] = '\0';
      error << buffer;
    }
  } while (num_read == -1 && errno == EINTR);

  if (num_read == 0) {
    GTEST_LOG_(FATAL) << error.GetString();
  } else {
    const int last_error = errno;
    GTEST_LOG_(FATAL) << "Error while reading death test internal: "
                      << GetLastErrnoDescription() << " [" << last_error << "]";
  }
}